

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  long in_RSI;
  char *pcVar6;
  int iVar7;
  int local_64;
  int local_60;
  int local_5c;
  _sockaddr_in servaddr;
  socklen_t local_44;
  timeval tv;
  
  local_5c = 0;
  local_64 = 0;
  local_60 = 0;
  iVar2 = (int)ctx;
  if (1 < iVar2) {
    iVar7 = iVar2 + -1;
    local_60 = 0;
    iVar5 = 1;
    local_64 = 0;
    local_5c = 0;
    do {
      pcVar4 = *(char **)(in_RSI + (long)iVar5 * 8);
      iVar1 = strcmp(pcVar4,"-d");
      if (iVar1 == 0) {
        if (iVar5 == iVar7) goto LAB_00105da4;
      }
      else {
        iVar1 = strcmp(pcVar4,"-f");
        if (iVar1 == 0) {
          if (iVar5 == iVar7) goto LAB_00105da4;
          local_60 = iVar5 + 1;
        }
        else {
          iVar1 = strcmp(pcVar4,"-s");
          if (iVar1 == 0) {
            if (iVar5 == iVar7) goto LAB_00105da4;
            local_64 = iVar5 + 1;
          }
          else {
            iVar1 = strcmp(pcVar4,"-c");
            if ((iVar1 != 0) || (iVar5 == iVar7)) {
LAB_00105da4:
              dnsExit();
              goto LAB_00105da9;
            }
            local_5c = atoi(*(char **)(in_RSI + 8 + (long)iVar5 * 8));
          }
        }
      }
      iVar5 = iVar5 + 2;
    } while (iVar5 < iVar2);
  }
  log_set_level(1);
  if (local_60 == 0) {
    pcVar4 = "dnsrelay.txt";
  }
  else {
    pcVar4 = *(char **)(in_RSI + (long)local_60 * 8);
  }
  load_local_record(&cacheset,pcVar4);
  iVar2 = 1000;
  if (local_5c != 0) {
    iVar2 = local_5c;
  }
  init_A_record_cache(&cacheset.A.temp,iVar2,0x19999999,0.7);
  init_A_record_cache(&cacheset.AAAA.temp,iVar2,0x19999999,0.7);
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x1f8,"init cache done");
  if (local_64 == 0) {
    pcVar4 = "10.3.9.4";
  }
  else {
    pcVar4 = *(char **)(in_RSI + (long)local_64 * 8);
  }
  memset(&query_server,0,0x10);
  query_server.sin_family = 2;
  query_server.sin_port = 0x3500;
  inet_pton(2,pcVar4,&query_server.sin_addr);
  signal(0xd,(__sighandler_t)0x1);
  server_sockfd = socket(2,2,0);
  if (server_sockfd < 0) {
LAB_00105da9:
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    pcVar6 = "socket open error";
    iVar2 = 0x212;
  }
  else {
    log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
            ,0x214,"server accept IPV4 connection only");
    query_sockfd = socket(2,2,0);
    if (query_sockfd < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar6 = "socket open error";
      iVar2 = 0x218;
    }
    else {
      tv.tv_sec = 1;
      tv.tv_usec = 0;
      iVar2 = setsockopt(query_sockfd,1,0x14,&tv,0x10);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0x21f,"set timeout error",pcVar4);
      }
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x221,"setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x229,"init all done");
      servaddr.sin_zero[0] = '\0';
      servaddr.sin_zero[1] = '\0';
      servaddr.sin_zero[2] = '\0';
      servaddr.sin_zero[3] = '\0';
      servaddr.sin_zero[4] = '\0';
      servaddr.sin_zero[5] = '\0';
      servaddr.sin_zero[6] = '\0';
      servaddr.sin_zero[7] = '\0';
      servaddr.sin_family = 2;
      servaddr.sin_port = 0x3500;
      servaddr.sin_addr.s_addr = 0;
      iVar2 = bind(server_sockfd,(sockaddr *)&servaddr,0x10);
      if (-1 < iVar2) {
        local_44 = 0x10;
        iVar2 = getsockname(server_sockfd,(sockaddr *)&servaddr,&local_44);
        if (iVar2 == -1) {
          perror("getsockname");
        }
        else {
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0x8a,"%s %d:%d:%d:%d:port:%d ","listen on ",(ulong)servaddr._0_8_ >> 0x20 & 0xff,
                  (ulong)servaddr._0_8_ >> 0x28 & 0xff,(ulong)servaddr._0_8_ >> 0x30 & 0xff,
                  (ulong)servaddr._0_8_ >> 0x38,
                  (ulong)(ushort)(servaddr.sin_port << 8 | servaddr.sin_port >> 8));
        }
        iVar2 = pthread_rwlock_init((pthread_rwlock_t *)&IDAdapter.rwlock,
                                    (pthread_rwlockattr_t *)0x0);
        return iVar2;
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar6 = "bind error";
      iVar2 = 0x19d;
    }
  }
  log_log(5,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          iVar2,"%s:%s",pcVar6,pcVar4);
  exit(1);
}

Assistant:

void init(int argc,char **argv) {
  int debug_lev=0,cache_num=0,dns_server=0,file=0;
  for(int i=1;i<argc;i++){
    if(!strcmp(argv[i],"-d")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        debug_lev=++i;
      }
    }
    else if(!strcmp(argv[i],"-f")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        file=++i;
      }
    }
    else if(!strcmp(argv[i],"-s")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        dns_server=++i;
      }
    }
    else if(!strcmp(argv[i],"-c")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        cache_num=atoi(argv[++i]);
      }
    }
    else{
        dnsExit();
    }
  }
  log_set_level(LOG_DEBUG);
  // log_set_level(debug_lev!=0?atoi(argv[debug_lev]):2);
  load_local_record(&cacheset,file==0?"dnsrelay.txt":argv[file]);
  init_A_record_cache(&cacheset.A.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  init_A_record_cache(&cacheset.AAAA.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  log_info("init cache done");

  init_query_server(dns_server==0?"10.3.9.4":argv[dns_server]);
  #ifdef _WIN64
    WSADATA wsaData;
    if(WSAStartup(MAKEWORD(2,2),&wsaData)!=0){//协商版本winsock 2.2
      log_fatal_exit_shortcut("winsock init error");
    }
    system("chcp 65001");//修改控制台格式为65001
  #endif
  #ifdef __linux
    signal(SIGPIPE, SIG_IGN);
    //忽略管道破裂
  #endif
  // signal(SIGINT,handle_)
  #ifdef ACCEPT_IPV6_REQUEST
  int no = 0;  
  if( (server_sockfd = socket(PF_INET6, SOCK_DGRAM, 0))<0){
    log_fatal_exit_shortcut("socket open error");
  }
  if (setsockopt(server_sockfd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&no, sizeof(no))<0){
    log_fatal_shortcut("failed set ipv6 only off:");
  }
  log_info("server accept IPV6 and IPV4 connection");
  #else
  if( (server_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  log_info("server accept IPV4 connection only");
  #endif

  if( (query_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  #ifdef __linux
  struct timeval tv;
  tv.tv_sec = 1;
  tv.tv_usec = 0;
  if (setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO,&tv,sizeof(tv)) < 0) {
      log_error("set timeout error",strerror(errno));
  }
  log_info("setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
  #elif defined(_WIN64)
  DWORD timeout = 1 * 1000;//设置超时时间
  if(setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO, (const char*)&timeout, sizeof timeout)<0){
      log_error_shortcut("set timeout error");
  }
  log_info("setting timeout = %d ms",timeout);
  #endif
  log_info("init all done");
  bind_addr();
  pthread_rwlock_init(&IDAdapter.rwlock, NULL);
}